

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::NeuralNetworkRegressor::_InternalParse
          (NeuralNetworkRegressor *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  Rep *pRVar2;
  bool bVar3;
  NeuralNetworkLayer *obj;
  NeuralNetworkPreprocessing *obj_00;
  MessageLite *pMVar4;
  NetworkUpdateParameters *msg;
  int iVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  Arena *arena;
  char cVar7;
  uint uVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  byte *local_40;
  InternalMetadata *local_38;
  
  local_40 = (byte *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (!bVar3) {
    local_38 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_40;
      uVar8 = (uint)bVar1;
      p = local_40 + 1;
      if ((char)bVar1 < '\0') {
        uVar8 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar9 = google::protobuf::internal::ReadTagFallback((char *)local_40,uVar8);
          p = (byte *)pVar9.first;
          uVar8 = pVar9.second;
        }
        else {
          p = local_40 + 2;
        }
      }
      cVar7 = (char)uVar8;
      local_40 = p;
      switch(uVar8 >> 3) {
      case 1:
        if (cVar7 != '\n') break;
        local_40 = p + -1;
        do {
          local_40 = local_40 + 1;
          pRVar2 = (this->layers_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar2 == (Rep *)0x0) {
LAB_002a129f:
            obj = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                            ((this->layers_).super_RepeatedPtrFieldBase.arena_);
            pMVar4 = (MessageLite *)
                     google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                               (&(this->layers_).super_RepeatedPtrFieldBase,obj);
          }
          else {
            iVar5 = (this->layers_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar2->allocated_size <= iVar5) goto LAB_002a129f;
            (this->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
            pMVar4 = (MessageLite *)pRVar2->elements[iVar5];
          }
          local_40 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,pMVar4,(char *)local_40);
          if (local_40 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_40 == 10));
        goto LAB_002a1479;
      case 2:
        if (cVar7 == '\x12') {
          local_40 = p + -1;
          do {
            local_40 = local_40 + 1;
            pRVar2 = (this->preprocessing_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar2 == (Rep *)0x0) {
LAB_002a1361:
              obj_00 = google::protobuf::Arena::
                       CreateMaybeMessage<CoreML::Specification::NeuralNetworkPreprocessing>
                                 ((this->preprocessing_).super_RepeatedPtrFieldBase.arena_);
              pMVar4 = (MessageLite *)
                       google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                 (&(this->preprocessing_).super_RepeatedPtrFieldBase,obj_00);
            }
            else {
              iVar5 = (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar2->allocated_size <= iVar5) goto LAB_002a1361;
              (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
              pMVar4 = (MessageLite *)pRVar2->elements[iVar5];
            }
            local_40 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                         (ctx,pMVar4,(char *)local_40);
            if (local_40 == (byte *)0x0) {
              return (char *)0x0;
            }
          } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_40 == 0x12));
          goto LAB_002a1479;
        }
        break;
      case 5:
        if (cVar7 == '(') {
          uVar6 = (ulong)(char)*p;
          local_40 = p + 1;
          if ((long)uVar6 < 0) {
            uVar8 = ((uint)*local_40 * 0x80 + (uint)*p) - 0x80;
            if (-1 < (char)*local_40) {
              uVar6 = (ulong)uVar8;
              local_40 = p + 2;
              goto LAB_002a131f;
            }
            local_40 = p;
            pVar10 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar8);
            iVar5 = (int)pVar10.second;
            local_40 = (byte *)pVar10.first;
            if (local_40 == (byte *)0x0) {
              return (char *)0x0;
            }
          }
          else {
LAB_002a131f:
            iVar5 = (int)uVar6;
          }
          this->arrayinputshapemapping_ = iVar5;
          goto LAB_002a1479;
        }
        break;
      case 6:
        if (cVar7 == '0') {
          uVar6 = (ulong)(char)*p;
          local_40 = p + 1;
          if ((long)uVar6 < 0) {
            uVar8 = ((uint)*local_40 * 0x80 + (uint)*p) - 0x80;
            if (-1 < (char)*local_40) {
              uVar6 = (ulong)uVar8;
              local_40 = p + 2;
              goto LAB_002a13e1;
            }
            local_40 = p;
            pVar10 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar8);
            iVar5 = (int)pVar10.second;
            local_40 = (byte *)pVar10.first;
            if (local_40 == (byte *)0x0) {
              return (char *)0x0;
            }
          }
          else {
LAB_002a13e1:
            iVar5 = (int)uVar6;
          }
          this->imageinputshapemapping_ = iVar5;
          goto LAB_002a1479;
        }
        break;
      case 10:
        if (cVar7 != 'R') break;
        msg = this->updateparams_;
        if (msg == (NetworkUpdateParameters *)0x0) {
          arena = (Arena *)(local_38->ptr_ & 0xfffffffffffffffc);
          if ((local_38->ptr_ & 1U) != 0) {
            arena = *(Arena **)arena;
          }
          msg = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::NetworkUpdateParameters>(arena);
          this->updateparams_ = msg;
        }
        local_40 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                     (ctx,&msg->super_MessageLite,(char *)local_40);
        goto LAB_002a146f;
      }
      if ((uVar8 == 0) || ((uVar8 & 7) == 4)) {
        if (p == (byte *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar8 - 1;
        return (char *)p;
      }
      if ((local_38->ptr_ & 1U) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(local_38);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((local_38->ptr_ & 0xfffffffffffffffcU) + 8);
      }
      local_40 = (byte *)google::protobuf::internal::UnknownFieldParse
                                   (uVar8,unknown,(char *)local_40,ctx);
LAB_002a146f:
      if (local_40 == (byte *)0x0) {
        return (char *)0x0;
      }
LAB_002a1479:
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_40;
}

Assistant:

const char* NeuralNetworkRegressor::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_layers(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_preprocessing(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 40)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_arrayinputshapemapping(static_cast<::CoreML::Specification::NeuralNetworkMultiArrayShapeMapping>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 48)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_imageinputshapemapping(static_cast<::CoreML::Specification::NeuralNetworkImageShapeMapping>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          ptr = ctx->ParseMessage(_internal_mutable_updateparams(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}